

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# N.h
# Opt level: O1

double __thiscall N::histo<double>(N *this,Alg<double> *alg,vector<N_*,_std::allocator<N_*>_> *line)

{
  pointer *pppNVar1;
  double dVar2;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> output;
  __normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> _Var3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  N r;
  _Any_data local_130;
  code *local_120;
  vector<N_*,_std::allocator<N_*>_> local_110;
  N *local_f8;
  N local_f0;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> *pCStack_60;
  CIt<__gnu_cxx::__normal_iterator<N**,std::vector<N*,std::allocator<N*>>>,N> local_58 [32];
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> local_38;
  
  local_f0.osi.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)this;
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<N**,std::vector<N*,std::allocator<N*>>>,__gnu_cxx::__ops::_Iter_equals_val<N*const>>
                    ((line->super__Vector_base<N_*,_std::allocator<N_*>_>)._M_impl.
                     super__Vector_impl_data._M_start,
                     (line->super__Vector_base<N_*,_std::allocator<N_*>_>)._M_impl.
                     super__Vector_impl_data._M_finish);
  if (_Var3._M_current ==
      (line->super__Vector_base<N_*,_std::allocator<N_*>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_f0.osi.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)this;
    std::vector<N*,std::allocator<N*>>::emplace_back<N*>
              ((vector<N*,std::allocator<N*>> *)line,(N **)&local_f0);
    N(&local_f0,this);
    all(this);
    std::function<double_(N_&,_std::vector<N_*,_std::allocator<N_*>_>_&)>::function
              ((function<double_(N_&,_std::vector<N_*,_std::allocator<N_*>_>_&)> *)&local_130,alg);
    std::vector<N_*,_std::allocator<N_*>_>::vector(&local_110,line);
    local_f8 = this;
    all(&local_f0);
    output._end._M_current = (N **)uStack_70;
    output._start._M_current = (N **)local_78;
    output._curr._M_current = (N **)local_68;
    output.next = pCStack_60;
    CIt<__gnu_cxx::__normal_iterator<N**,std::vector<N*,std::allocator<N*>>>,N>::
    map<N::histo<double>(std::function<double(N&,std::vector<N*,std::allocator<N*>>&)>const&,std::vector<N*,std::allocator<N*>>)::_lambda(N*)_1_>
              (&local_38,local_58,(anon_class_64_3_558eef7f *)&local_130,output);
    if (local_110.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_110.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_110.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_110.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_120 != (code *)0x0) {
      (*local_120)(&local_130,&local_130,__destroy_functor);
    }
    pppNVar1 = &(line->super__Vector_base<N_*,_std::allocator<N_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + -1;
    if ((alg->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00111809;
    dVar2 = (*alg->_M_invoker)((_Any_data *)alg,&local_f0,line);
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>_&>
      ::_S_vtable._M_arr
      [local_f0.data.
       super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
       .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
       super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
       super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
       super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
       super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>._M_index].
      _M_data)((anon_class_1_0_00000001 *)local_58,&local_f0.data);
    local_f0.data.
    super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
    .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
    super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
    super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
    super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
    super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>._M_index =
         0xff;
    if (local_f0.os.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_f0.os.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f0.os.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_f0.os.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_f0.ps.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_f0.ps.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f0.ps.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_f0.ps.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((N *)local_f0.osi.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start != (N *)0x0) {
      operator_delete(local_f0.osi.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_f0.osi.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_f0.osi.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    uVar5 = SUB84(dVar2,0);
    uVar6 = (undefined4)((ulong)dVar2 >> 0x20);
  }
  else {
    if ((alg->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
LAB_00111809:
      uVar4 = std::__throw_bad_function_call();
      __clang_call_terminate(uVar4);
    }
    dVar2 = (*alg->_M_invoker)((_Any_data *)alg,this,line);
    uVar5 = SUB84(dVar2,0);
    uVar6 = (undefined4)((ulong)dVar2 >> 0x20);
  }
  return (double)CONCAT44(uVar6,uVar5);
}

Assistant:

B histo(const alg::Alg<B>& alg, vector<N*> line = {}) {
        if (find(line.begin(), line.end(), this) != line.end()) return alg(*this, line);
        line.push_back(this);

        auto r(*this);
        this->all().map([&, alg, line](N* n){return new (g) N(n->histo(alg, line));}, r.all());

        line.pop_back();
        return alg(r, line);
    }